

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall glcts::GeometryShaderAdjacencyTests::deinit(GeometryShaderAdjacencyTests *this)

{
  bool bVar1;
  reference ppAVar2;
  __normal_iterator<glcts::AdjacencyTestData_**,_std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>_>
  local_20;
  __normal_iterator<glcts::AdjacencyTestData_**,_std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>_>
  local_18;
  iterator it;
  GeometryShaderAdjacencyTests *this_local;
  
  it._M_current = (AdjacencyTestData **)this;
  local_18._M_current =
       (AdjacencyTestData **)
       std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::begin
                 (&this->m_tests_data);
  while( true ) {
    local_20._M_current =
         (AdjacencyTestData **)
         std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::end
                   (&this->m_tests_data);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<glcts::AdjacencyTestData_**,_std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>_>
              ::operator*(&local_18);
    if (*ppAVar2 != (AdjacencyTestData *)0x0) {
      (*(*ppAVar2)->_vptr_AdjacencyTestData[1])();
    }
    ppAVar2 = __gnu_cxx::
              __normal_iterator<glcts::AdjacencyTestData_**,_std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>_>
              ::operator*(&local_18);
    *ppAVar2 = (AdjacencyTestData *)0x0;
    __gnu_cxx::
    __normal_iterator<glcts::AdjacencyTestData_**,_std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::clear
            (&this->m_tests_data);
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::deinit(void)
{
	for (std::vector<AdjacencyTestData*>::iterator it = m_tests_data.begin(); it != m_tests_data.end(); ++it)
	{
		delete *it;
		*it = NULL;
	}

	m_tests_data.clear();

	/* Call base class' deinit() function. */
	glcts::TestCaseGroupBase::deinit();
}